

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.hpp
# Opt level: O1

bool ghc::filesystem::copy_file(path *from,path *to,copy_options option)

{
  int code;
  bool bVar1;
  filesystem_error *this;
  error_code ec_00;
  error_code ec;
  string sStack_58;
  error_code local_38;
  
  local_38._M_value = 0;
  local_38._M_cat = (error_category *)std::_V2::system_category();
  bVar1 = copy_file(from,to,option,&local_38);
  code = local_38._M_value;
  if (local_38._M_value == 0) {
    return bVar1;
  }
  this = (filesystem_error *)__cxa_allocate_exception(0x90);
  detail::systemErrorText<int>(&sStack_58,code);
  ec_00._4_4_ = 0;
  ec_00._M_value = code;
  ec_00._M_cat = local_38._M_cat;
  filesystem_error::filesystem_error(this,&sStack_58,from,to,ec_00);
  __cxa_throw(this,&filesystem_error::typeinfo,filesystem_error::~filesystem_error);
}

Assistant:

GHC_INLINE bool copy_file(const path& from, const path& to, copy_options option)
{
    std::error_code ec;
    auto result = copy_file(from, to, option, ec);
    if (ec) {
        throw filesystem_error(detail::systemErrorText(ec.value()), from, to, ec);
    }
    return result;
}